

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

reference __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
::iterator::operator*(iterator *this)

{
  ctrl_t *ctrl;
  GenerationType generation;
  GenerationType *generation_ptr;
  reference ppVar1;
  iterator *this_local;
  
  ctrl = this->ctrl_;
  generation = HashSetIteratorGenerationInfoDisabled::generation
                         ((HashSetIteratorGenerationInfoDisabled *)this);
  generation_ptr =
       HashSetIteratorGenerationInfoDisabled::generation_ptr
                 ((HashSetIteratorGenerationInfoDisabled *)this);
  AssertIsFull(ctrl,generation,generation_ptr,"operator*()");
  ppVar1 = unchecked_deref(this);
  return ppVar1;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }